

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O3

int set_default_mode(int f,int n)

{
  char *pcVar1;
  maps_s *pmVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int local_48;
  short sStack_44;
  undefined2 uStack_42;
  char modebuf [32];
  
  iVar6 = 0;
  pcVar1 = eread("Set Default Mode: ",(char *)&local_48,0x20,8);
  if (pcVar1 == (char *)0x0) {
    iVar6 = 2;
  }
  else if (*pcVar1 != '\0') {
    pmVar2 = name_mode((char *)&local_48);
    if (pmVar2 == (maps_s *)0x0) {
      dobeep();
      iVar6 = 0;
      ewprintf("can\'t find mode %s",&local_48);
    }
    else {
      if (((f & 7U) == 0) && (-1 < defb_nmodes)) {
        lVar3 = 0;
        do {
          if (*(maps_s **)((long)defb_modes + lVar3) == pmVar2) {
            n = 0;
            goto LAB_00114842;
          }
          lVar3 = lVar3 + 8;
        } while ((ulong)(uint)defb_nmodes * 8 + 8 != lVar3);
      }
      if (n < 1) {
LAB_00114842:
        if (defb_nmodes < 1) {
          return 1;
        }
        uVar4 = 1;
        while (pmVar2 != defb_modes[uVar4]) {
          uVar4 = uVar4 + 1;
          if ((ulong)(uint)defb_nmodes + 1 == uVar4) {
            return 1;
          }
        }
        if ((int)uVar4 < defb_nmodes) {
          do {
            defb_modes[uVar4] = defb_modes[uVar4 + 1];
            uVar4 = uVar4 + 1;
          } while ((uint)defb_nmodes != uVar4);
        }
        defb_nmodes = defb_nmodes + -1;
      }
      else {
        lVar3 = (long)defb_nmodes;
        if (-1 < lVar3) {
          lVar5 = 0;
          do {
            if (*(maps_s **)((long)defb_modes + lVar5) == pmVar2) {
              return 1;
            }
            lVar5 = lVar5 + 8;
          } while ((ulong)(uint)defb_nmodes * 8 + 8 != lVar5);
          if (2 < defb_nmodes) {
            dobeep();
            ewprintf("Too many modes");
            return 0;
          }
        }
        defb_nmodes = defb_nmodes + 1;
        defb_modes[lVar3 + 1] = pmVar2;
      }
      if (modebuf._0_2_ == 0x65 &&
          CONCAT26(uStack_42,CONCAT24(sStack_44,local_48)) == 0x746972777265766f) {
        defb_flag = (defb_flag & 0xfffffff7U) + (uint)(0 < n) * 8;
      }
      iVar6 = 1;
      if (sStack_44 == 0x62 && local_48 == 0x61746f6e) {
        if (n < 1) {
          defb_flag = defb_flag & 0xfffffffb;
        }
        else {
          defb_flag = defb_flag | 4;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int
set_default_mode(int f, int n)
{
	int	 i;
	struct maps_s	*m;
	char	 modebuf[32], *bufp;

	if ((bufp = eread("Set Default Mode: ", modebuf, sizeof(modebuf),
	    EFNEW)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	if ((m = name_mode(modebuf)) == NULL) {
		dobeep();
		ewprintf("can't find mode %s", modebuf);
		return (FALSE);
	}
	if (!(f & FFARG)) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m) {
				/* mode already set */
				n = 0;
				break;
			}
	}
	if (n > 0) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m)
				/* mode already set */
				return (TRUE);
		if (defb_nmodes >= PBMODES - 1) {
			dobeep();
			ewprintf("Too many modes");
			return (FALSE);
		}
		defb_modes[++defb_nmodes] = m;
	} else {
		/* fundamental is defb_modes[0] and can't be unset */
		for (i = 1; i <= defb_nmodes && m != defb_modes[i]; i++);
		if (i > defb_nmodes)
			/* mode was not set */
			return (TRUE);
		for (; i < defb_nmodes; i++)
			defb_modes[i] = defb_modes[i + 1];
		defb_nmodes--;
	}
	if (strcmp(modebuf, "overwrite") == 0) {
		if (n <= 0)
			defb_flag &= ~BFOVERWRITE;
		else
			defb_flag |= BFOVERWRITE;
	}
	if (strcmp(modebuf, "notab") == 0) {
		if (n <= 0)
			defb_flag &= ~BFNOTAB;
		else
			defb_flag |= BFNOTAB;
	}
	return (TRUE);
}